

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jediorder_wang_test.cc
# Opt level: O0

int main(int param_1,char **argv)

{
  value_type vVar1;
  char *pcVar2;
  bool bVar3;
  istream *piVar4;
  undefined8 uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double jediorder;
  undefined1 local_930 [4];
  uint i;
  BracketNotationParser<label::JSONLabel> bnp;
  vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
  trees_collection;
  TreeIndexer ti2;
  TreeIndexer ti1;
  string line;
  size_t single_value;
  ifstream results_file;
  undefined1 local_298 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> results;
  WANG wang_algorithm;
  CostModel ucm;
  LabelDictionary ld;
  string local_70 [8];
  string results_file_name;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string input_file_name;
  char **argv_local;
  int param_0_local;
  
  pcVar2 = argv[1];
  input_file_name.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pcVar2,&local_39);
  std::allocator<char>::~allocator(&local_39);
  pcVar2 = *(char **)(input_file_name.field_2._8_8_ + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,pcVar2,(allocator<char> *)&ld.field_0x57);
  std::allocator<char>::~allocator((allocator<char> *)&ld.field_0x57);
  label::LabelDictionary<label::JSONLabel>::LabelDictionary
            ((LabelDictionary<label::JSONLabel> *)&ucm);
  cost_model::UnitCostModelJSON<label::JSONLabel>::UnitCostModelJSON
            ((UnitCostModelJSON<label::JSONLabel> *)
             &wang_algorithm.fav_child_dt_.data_.super__Vector_base<double,_std::allocator<double>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (LabelDictionary<label::JSONLabel> *)&ucm);
  json::WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
  JEDIAlgorithm((WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
                 *)&results.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                (UnitCostModelJSON<label::JSONLabel> *)
                &wang_algorithm.fav_child_dt_.data_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_298);
  std::ifstream::ifstream(&single_value,local_70,8);
  line.field_2._8_8_ = 0;
  std::__cxx11::string::string
            ((string *)
             &ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
              _M_single_bucket);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&single_value,
                        (string *)
                        &ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
                         _M_single_bucket);
    bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar3) break;
    uVar5 = std::__cxx11::string::c_str();
    __isoc99_sscanf(uVar5,"%zu");
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_298,
               (value_type_conflict2 *)(line.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string
            ((string *)
             &ti1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
              _M_single_bucket);
  node::TreeIndexJSON::TreeIndexJSON
            ((TreeIndexJSON *)
             &ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
              _M_single_bucket);
  node::TreeIndexJSON::TreeIndexJSON
            ((TreeIndexJSON *)
             &trees_collection.
              super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::vector
            ((vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_> *
             )((long)&bnp.kMatchRightBracket.field_2 + 8));
  parser::BracketNotationParser<label::JSONLabel>::BracketNotationParser
            ((BracketNotationParser<label::JSONLabel> *)local_930);
  parser::BracketNotationParser<label::JSONLabel>::parse_collection
            ((BracketNotationParser<label::JSONLabel> *)local_930,
             (vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_> *
             )((long)&bnp.kMatchRightBracket.field_2 + 8),(string *)local_38);
  jediorder._4_4_ = 1;
  do {
    sVar6 = std::
            vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::
            size((vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                  *)((long)&bnp.kMatchRightBracket.field_2 + 8));
    if (sVar6 <= jediorder._4_4_) {
      argv_local._4_4_ = 0;
LAB_0010404f:
      parser::BracketNotationParser<label::JSONLabel>::~BracketNotationParser
                ((BracketNotationParser<label::JSONLabel> *)local_930);
      std::vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::
      ~vector((vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
               *)((long)&bnp.kMatchRightBracket.field_2 + 8));
      node::TreeIndexJSON::~TreeIndexJSON
                ((TreeIndexJSON *)
                 &trees_collection.
                  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      node::TreeIndexJSON::~TreeIndexJSON
                ((TreeIndexJSON *)
                 &ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
                  _M_single_bucket);
      std::ifstream::~ifstream(&single_value);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_298);
      json::WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
      ~WangTreeIndex((WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
                      *)&results.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      label::LabelDictionary<label::JSONLabel>::~LabelDictionary
                ((LabelDictionary<label::JSONLabel> *)&ucm);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string((string *)local_38);
      return argv_local._4_4_;
    }
    pvVar7 = std::
             vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::
             operator[]((vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                         *)((long)&bnp.kMatchRightBracket.field_2 + 8),(ulong)jediorder._4_4_);
    node::
    index_tree<node::TreeIndexJSON,label::JSONLabel,cost_model::UnitCostModelJSON<label::JSONLabel>>
              ((TreeIndexJSON *)
               &ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
                _M_single_bucket,pvVar7,(LabelDictionary<label::JSONLabel> *)&ucm,
               (UnitCostModelJSON<label::JSONLabel> *)
               &wang_algorithm.fav_child_dt_.data_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    pvVar7 = std::
             vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::
             operator[]((vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                         *)((long)&bnp.kMatchRightBracket.field_2 + 8),(ulong)(jediorder._4_4_ - 1))
    ;
    node::
    index_tree<node::TreeIndexJSON,label::JSONLabel,cost_model::UnitCostModelJSON<label::JSONLabel>>
              ((TreeIndexJSON *)
               &trees_collection.
                super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar7,
               (LabelDictionary<label::JSONLabel> *)&ucm,
               (UnitCostModelJSON<label::JSONLabel> *)
               &wang_algorithm.fav_child_dt_.data_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    dVar10 = json::
             WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
             jedi((WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
                   *)&results.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (TreeIndexJSON *)
                  &ti2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
                   _M_single_bucket,
                  (TreeIndexJSON *)
                  &trees_collection.
                   super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_298,
                        (ulong)(jediorder._4_4_ - 1));
    vVar1 = *pvVar8;
    auVar12._8_4_ = (int)(vVar1 >> 0x20);
    auVar12._0_8_ = vVar1;
    auVar12._12_4_ = 0x45300000;
    dVar11 = (auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
    if ((dVar10 != dVar11) || (NAN(dVar10) || NAN(dVar11))) {
      poVar9 = std::operator<<((ostream *)&std::cout," ERROR Incorrect JediOrder for trees ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,jediorder._4_4_);
      poVar9 = std::operator<<(poVar9," and ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,jediorder._4_4_ + 1);
      poVar9 = std::operator<<(poVar9,": ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar10);
      poVar9 = std::operator<<(poVar9," instead of ");
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_298,
                          (ulong)(jediorder._4_4_ - 1));
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pvVar8);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
      goto LAB_0010404f;
    }
    jediorder._4_4_ = jediorder._4_4_ + 1;
  } while( true );
}

Assistant:

int main(int, char** argv) {

  // Input file name.
  std::string input_file_name = std::string(argv[1]);
  // Input results file name.
  std::string results_file_name = std::string(argv[2]);

  // Type aliases.
  using Label = label::JSONLabel;
  using CostModel = cost_model::UnitCostModelJSON<Label>;
  using LabelDictionary = label::LabelDictionary<Label>;
  using TreeIndexer = node::TreeIndexJSON;
  using WANG = json::WangTreeIndex<CostModel, TreeIndexer>;
  
  // Initialize label dictionary - separate dictionary for each test tree
  // because it is easier to keep track of label ids.
  LabelDictionary ld;
  
  // Initialize cost model.
  CostModel ucm(ld);
  WANG wang_algorithm(ucm);
  
  // Read results from file.
  std::vector<size_t> results;
  std::ifstream results_file(results_file_name);
  std::size_t single_value = 0;
  for (std::string line; std::getline(results_file, line);) {
    sscanf(line.c_str(), "%zu", &single_value);
    results.push_back(single_value);
  }

  // Initialize two tree indexes.
  // Use TreeIndexAll that is a superset of all algorithms' indexes.
  TreeIndexer ti1;
  TreeIndexer ti2;

  // Create the container to store all trees.
  std::vector<node::Node<Label>> trees_collection;
  
  // Parse the dataset.
  parser::BracketNotationParser<Label> bnp;
  bnp.parse_collection(trees_collection, input_file_name);

  // iterate over all trees in the given collection
  for (unsigned int i = 1; i < trees_collection.size(); i++) {
    // Index input trees.
    node::index_tree(ti1, trees_collection[i], ld, ucm);
    node::index_tree(ti2, trees_collection[i-1], ld, ucm);

    // Compute the label intersection for two consecutive trees.
    double jediorder = wang_algorithm.jedi(ti1, ti2);

    // Verify the result against the given solution.
    if (jediorder != results[i - 1]) {
      std::cout << " ERROR Incorrect JediOrder for trees " << i << " and " 
          << i+1 << ": " << jediorder << " instead of " << results[i - 1] 
          << std::endl;
      return -1;
    }
  }
  
  return 0;
}